

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void out_state_init(out_stream_info *stream)

{
  out_stream_info *stream_local;
  
  stream->linepos = '\0';
  stream->linecol = '\0';
  stream->linebuf[0] = '\0';
  stream->cur_attr = 0;
  stream->os_attr = 0;
  stream->linecnt = 0;
  stream->allcapsflag = '\0';
  stream->nocapsflag = '\0';
  stream->capsflag = '\0';
  stream->capturing = 0;
  stream->capture_obj = 0xffff;
  stream->preview = 0;
  stream->just_did_nl = 0;
  stream->use_more_mode = 0;
  stream->os_line_wrap = 0;
  stream->html_target = 0;
  stream->plain_text_target = 0;
  stream->html_mode = 0;
  stream->html_mode_flag = 0;
  stream->html_in_ignore = 0;
  stream->html_in_title = 0;
  stream->html_defer_br = 0;
  stream->html_quote_level = 0;
  stream->html_pre_level = 0;
  stream->html_allow_alt = 0;
  return;
}

Assistant:

static void out_state_init(out_stream_info *stream)
{
    /* start out at the first column */
    stream->linepos = 0;
    stream->linecol = 0;
    stream->linebuf[0] = '\0';

    /* set normal text attributes */
    stream->cur_attr = 0;
    stream->os_attr = 0;

    /* start out at the first line */
    stream->linecnt = 0;

    /* we're not in either "caps", "nocaps", or "allcaps" mode yet */
    stream->capsflag = stream->nocapsflag = stream->allcapsflag = FALSE;

    /* we're not capturing yet */
    stream->capturing = FALSE;
    stream->capture_obj = MCMONINV;

    /* we aren't previewing a line yet */
    stream->preview = 0;

    /* we haven't flushed a new line yet */
    stream->just_did_nl = FALSE;

    /* presume this stream does not use "MORE" mode */
    stream->use_more_mode = FALSE;

    /* presume this stream uses formatter-level line wrapping */
    stream->os_line_wrap = FALSE;

    /* assume that the underlying system is not HTML-enabled */
    stream->html_target = FALSE;

    /* presume this target accepts OS highlighting sequences */
    stream->plain_text_target = FALSE;

    /* start out in text mode */
    stream->html_mode = FALSE;

    /* start out in "normal" lexical state */
    stream->html_mode_flag = HTML_MODE_NORMAL;

    /* not in an ignored tag yet */
    stream->html_in_ignore = FALSE;

    /* not in title mode yet */
    stream->html_in_title = FALSE;

    /* not yet deferring line breaks */
    stream->html_defer_br = HTML_DEFER_BR_NONE;

    /* not yet in quotes */
    stream->html_quote_level = 0;

    /* not yet in a PRE block */
    stream->html_pre_level = 0;

    /* not in an ALT tag yet */
    stream->html_allow_alt = FALSE;
}